

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyArchiveGetNextEntry(SyArchive *pArch,SyArchiveEntry **ppEntry)

{
  SyArchiveEntry *pNext;
  SyArchiveEntry **ppEntry_local;
  SyArchive *pArch_local;
  
  if (pArch->pCursor == (SyArchiveEntry *)0x0) {
    pArch->pCursor = pArch->pList;
    pArch_local._4_4_ = -0x12;
  }
  else {
    *ppEntry = pArch->pCursor;
    pArch->pCursor = pArch->pCursor->pNext;
    pArch_local._4_4_ = 0;
  }
  return pArch_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyArchiveGetNextEntry(SyArchive *pArch, SyArchiveEntry **ppEntry)
 {
	SyArchiveEntry *pNext;
	if( pArch->pCursor == 0 ){
		/* Rewind the cursor */
		pArch->pCursor = pArch->pList;
		return SXERR_EOF;
	}
	*ppEntry = pArch->pCursor;
	 pNext = pArch->pCursor->pNext;
	 /* Advance the cursor to the next entry */
	 pArch->pCursor = pNext;
	 return SXRET_OK;
  }